

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweeper_kba_c_kernels.h
# Opt level: O2

void Sweeper_get_semiblock_bounds
               (Bool_t *has_lo,Bool_t *has_hi,int *imin,int *imax,int *imax_up2,int ncell,int dim,
               int dir,int semiblock_step,int nsemiblock)

{
  bool bVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  
  if (8 < (uint)nsemiblock) {
    __assert_fail("nsemiblock >= 0 && nsemiblock <= NOCTANT",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/sweeper_kba_kernels.h"
                  ,0x193,"Bool_t is_axis_semiblocked(int, int)");
  }
  iVar4 = 1 << ((byte)dim & 0x1f);
  if ((uint)semiblock_step < (uint)nsemiblock) {
    if ((dir != -1) && (dir != 1)) {
      __assert_fail("dir == DIR_UP || dir == DIR_DN",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/sweeper_kba_kernels.h"
                    ,0x1a4,"Bool_t is_semiblock_min_when_semiblocked(int, int, int, int)");
    }
    bVar1 = nsemiblock <= iVar4;
    bVar3 = dir != 1 ^ (byte)((uint)~semiblock_step >> ((byte)dim & 0x1f));
    *has_lo = (bVar3 | bVar1) & 1;
    *has_hi = (byte)(bVar3 ^ 1 | bVar1) & 1;
    iVar2 = 0;
    if ((bVar3 & 1) == 0 && !bVar1) {
      iVar2 = (ncell + 1) / 2;
    }
    *imin = iVar2;
    iVar2 = ncell;
    if (((bVar3 ^ 1) & 1) == 0 && !bVar1) {
      iVar2 = (ncell + 1) / 2;
    }
    *imax = iVar2 + -1;
    if ((nsemiblock <= iVar4) || ((~bVar3 & (byte)ncell & 1) == 0)) {
      iVar2 = iVar2 + -1;
    }
    *imax_up2 = iVar2;
    return;
  }
  __assert_fail("semiblock_step >= 0 && semiblock_step < nsemiblock",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/sweeper_kba_kernels.h"
                ,0x1a2,"Bool_t is_semiblock_min_when_semiblocked(int, int, int, int)");
}

Assistant:

TARGET_HD static inline void Sweeper_get_semiblock_bounds(
  Bool_t* __restrict__ has_lo,
  Bool_t* __restrict__ has_hi,
  int*    __restrict__ imin,
  int*    __restrict__ imax,
  int*    __restrict__ imax_up2,
  int ncell,
  int dim,
  int dir,
  int semiblock_step,
  int nsemiblock
  )
{
  /*===================================================================
  =    is_semiblocked: indicate whether the block is broken into
  =      semiblocks along the x axis.
  =    is_semiblock_lo: on this semiblock step for this thread
  =      do we process the lower or the higher semiblock along
  =      the x axis.  Only meaningful if is_semiblocked.
  =    has_lo: does this semiblock contain the lowest cell of the
  =      block along the selected axis.
  =    has_hi: similarly.
  =    imin: the lowest cell boundary of the semiblock within the
  =      block along the selected axis, inclusive of endpoints.
  =    imax: similarly.
  =    imax_up2: make lower/upper semiblock of same size, so that
  =      every device octant thread has the same loop trip count,
  =      so that syncthreads works right, later mask out the
  =      added cells so no real work is done.
  ===================================================================*/

  const Bool_t is_semiblocked = is_axis_semiblocked(nsemiblock, dim);
  const Bool_t is_semiblock_lo = is_semiblock_min_when_semiblocked(
            nsemiblock, semiblock_step, dim, dir );

  *has_lo =     is_semiblock_lo   || ! is_semiblocked;
  *has_hi = ( ! is_semiblock_lo ) || ! is_semiblocked;

  /*---Get semiblock bounds, inclusive of endpoints---*/

  *imin =     *has_lo   ? 0 : ( (ncell+1) / 2 );
  *imax = ( ! *has_hi ) ?     ( (ncell+1) / 2 - 1 ) : ( ncell - 1 );

  *imax_up2 = ( is_semiblocked &&
                ( ncell % 2 ) &&
                ( ! is_semiblock_lo ) )
              ?  ( *imax + 1 ) : *imax;
}